

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

void Intra4Preds_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  ushort uVar12;
  unkuint9 Var13;
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  int iVar22;
  uint8_t *puVar23;
  uint8_t uVar24;
  long lVar25;
  short sVar26;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 auVar27 [16];
  undefined1 uVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 uVar35;
  undefined4 uVar36;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 auVar39 [16];
  undefined1 uVar47;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 uVar52;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 uVar53;
  int iVar54;
  undefined1 uVar60;
  undefined1 auVar55 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined5 uVar37;
  undefined6 uVar38;
  undefined1 uVar48;
  undefined1 auVar56 [16];
  undefined1 uVar57;
  undefined1 uVar58;
  undefined1 uVar59;
  
  uVar36 = *(undefined4 *)top;
  uVar1 = (ulong)(ushort)uVar36 & 0xffffffffffff00ff;
  auVar14._8_4_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14[0xc] = (char)((uint)uVar36 >> 0x18);
  auVar15[8] = (char)((uint)uVar36 >> 0x10);
  auVar15._0_8_ = uVar1;
  auVar15[9] = 0;
  auVar15._10_3_ = auVar14._10_3_;
  auVar20._5_8_ = 0;
  auVar20._0_5_ = auVar15._8_5_;
  auVar16[4] = (char)((uint)uVar36 >> 8);
  auVar16._0_4_ = (int)uVar1;
  auVar16[5] = 0;
  auVar16._6_7_ = SUB137(auVar20 << 0x40,6);
  uVar36 = *(undefined4 *)(top + -5);
  uVar11 = (ulong)(ushort)uVar36 & 0xffffffffffff00ff;
  auVar17._8_4_ = 0;
  auVar17._0_8_ = uVar11;
  auVar17[0xc] = (char)((uint)uVar36 >> 0x18);
  auVar18[8] = (char)((uint)uVar36 >> 0x10);
  auVar18._0_8_ = uVar11;
  auVar18[9] = 0;
  auVar18._10_3_ = auVar17._10_3_;
  auVar21._5_8_ = 0;
  auVar21._0_5_ = auVar18._8_5_;
  auVar19[4] = (char)((uint)uVar36 >> 8);
  auVar19._0_4_ = (int)uVar11;
  auVar19[5] = 0;
  auVar19._6_7_ = SUB137(auVar21 << 0x40,6);
  iVar22 = ((uint)(uint3)(auVar17._10_3_ >> 0x10) + (uint)(uint3)(auVar14._10_3_ >> 0x10) +
            auVar19._4_4_ + auVar16._4_4_ +
            auVar18._8_4_ + auVar15._8_4_ + (int)uVar11 + (int)uVar1 + 4 >> 3 & 0xff) * 0x1010101;
  *(int *)(dst + 0x600) = iVar22;
  *(int *)(dst + 0x620) = iVar22;
  *(int *)(dst + 0x640) = iVar22;
  *(int *)(dst + 0x660) = iVar22;
  puVar23 = dst + 0x604;
  uVar36 = *(undefined4 *)top;
  lVar25 = 4;
  do {
    auVar27 = pshuflw(ZEXT416((uint)top[lVar25 + -6] - (uint)top[-1]),
                      ZEXT416((uint)top[lVar25 + -6] - (uint)top[-1]),0);
    sVar26 = auVar27._0_2_ + ((ushort)uVar36 & 0xff);
    sVar28 = auVar27._2_2_ + (ushort)(byte)((uint)uVar36 >> 8);
    sVar29 = auVar27._4_2_ + (ushort)(byte)((uint)uVar36 >> 0x10);
    sVar30 = auVar27._6_2_ + (ushort)(byte)((uint)uVar36 >> 0x18);
    *(uint *)puVar23 =
         CONCAT13((0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30),
                  CONCAT12((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29),
                           CONCAT11((0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28)
                                    ,(0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 -
                                     (0xff < sVar26))));
    puVar23 = puVar23 + 0x20;
    lVar25 = lVar25 + -1;
  } while (lVar25 != 0);
  uVar1 = *(ulong *)(top + -1);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar1;
  auVar41._8_4_ = (int)uVar1;
  auVar41._0_8_ = uVar1;
  auVar41._12_4_ = (int)(uVar1 >> 0x20);
  uVar45 = (undefined1)(uVar1 >> 0x10);
  auVar39[0] = pavgb((char)uVar1,uVar45);
  uVar46 = (undefined1)(uVar1 >> 0x18);
  uVar35 = (undefined1)(uVar1 >> 8);
  auVar39[1] = pavgb(uVar35,uVar46);
  uVar47 = (undefined1)(uVar1 >> 0x20);
  auVar39[2] = pavgb(uVar45,uVar47);
  uVar48 = (undefined1)(uVar1 >> 0x28);
  auVar39[3] = pavgb(uVar46,uVar48);
  uVar52 = (undefined1)(uVar1 >> 0x30);
  auVar39[4] = pavgb(uVar47,uVar52);
  uVar34 = (undefined1)(uVar1 >> 0x38);
  auVar39[5] = pavgb(uVar48,uVar34);
  auVar39[6] = pavgb(uVar52,0);
  auVar39[7] = pavgb(uVar34,0);
  auVar39[8] = pavgb(0,0);
  auVar39[9] = pavgb(0,0);
  auVar39[10] = pavgb(0,0);
  auVar39[0xb] = pavgb(0,0);
  auVar39[0xc] = pavgb(0,0);
  auVar39[0xd] = pavgb(0,0);
  auVar39[0xe] = pavgb(0,0);
  auVar39[0xf] = pavgb(0,0);
  auVar27 = psubusb(auVar39,(auVar41 >> 0x50 ^ auVar27) & _DAT_0014eb50);
  uVar35 = pavgb(auVar27[0],uVar35);
  uVar45 = pavgb(auVar27[1],uVar45);
  uVar46 = pavgb(auVar27[2],uVar46);
  uVar47 = pavgb(auVar27[3],uVar47);
  pavgb(auVar27[4],uVar48);
  pavgb(auVar27[5],uVar52);
  pavgb(auVar27[6],uVar34);
  pavgb(auVar27[7],0);
  pavgb(auVar27[8],0);
  pavgb(auVar27[9],0);
  pavgb(auVar27[10],0);
  pavgb(auVar27[0xb],0);
  pavgb(auVar27[0xc],0);
  pavgb(auVar27[0xd],0);
  pavgb(auVar27[0xe],0);
  pavgb(auVar27[0xf],0);
  lVar25 = 0;
  do {
    *(uint *)(dst + lVar25 + 0x608) = CONCAT13(uVar47,CONCAT12(uVar46,CONCAT11(uVar45,uVar35)));
    lVar25 = lVar25 + 0x20;
  } while (lVar25 != 0x80);
  bVar3 = top[-2];
  bVar4 = top[-3];
  bVar5 = top[-4];
  bVar6 = top[-5];
  *(uint *)(dst + 0x60c) = ((uint)top[-1] + (uint)bVar3 * 2 + (uint)bVar4 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x62c) = ((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x64c) = ((uint)bVar4 + (uint)bVar5 * 2 + 2 + (uint)bVar6 >> 2) * 0x1010101;
  *(uint *)(dst + 0x66c) = ((uint)bVar5 + (uint)bVar6 + 2 + (uint)bVar6 * 2 >> 2) * 0x1010101;
  auVar27 = _DAT_0014eb50;
  uVar2 = (undefined8)*(unkuint9 *)(top + -5);
  uVar24 = top[3];
  Var13 = *(unkuint9 *)(top + -5);
  uVar46 = (undefined1)((ulong)uVar2 >> 0x10);
  auVar40[0] = pavgb(uVar46,(char)uVar2);
  uVar45 = (undefined1)((ulong)uVar2 >> 8);
  uVar47 = (undefined1)((ulong)uVar2 >> 0x18);
  auVar40[1] = pavgb(uVar47,uVar45);
  uVar48 = (undefined1)((ulong)uVar2 >> 0x20);
  auVar40[2] = pavgb(uVar48,uVar46);
  uVar52 = (undefined1)((ulong)uVar2 >> 0x28);
  auVar40[3] = pavgb(uVar52,uVar47);
  uVar34 = (undefined1)((ulong)uVar2 >> 0x30);
  auVar40[4] = pavgb(uVar34,uVar48);
  uVar35 = (undefined1)((ulong)uVar2 >> 0x38);
  auVar40[5] = pavgb(uVar35,uVar52);
  auVar40[6] = pavgb(uVar24,uVar34);
  auVar40[7] = pavgb(0,uVar35);
  auVar40[8] = pavgb(0,uVar24);
  auVar40[9] = pavgb(0,0);
  auVar40[10] = pavgb(0,0);
  auVar40[0xb] = pavgb(0,0);
  auVar40[0xc] = pavgb(0,0);
  auVar40[0xd] = pavgb(0,0);
  auVar40[0xe] = pavgb(0,0);
  auVar40[0xf] = pavgb(0,0);
  auVar31._9_7_ = 0;
  auVar31._0_9_ = Var13 >> 0x10 ^ Var13;
  auVar41 = psubusb(auVar40,auVar31 & _DAT_0014eb50);
  uVar45 = pavgb(auVar41[0],uVar45);
  uVar46 = pavgb(auVar41[1],uVar46);
  uVar47 = pavgb(auVar41[2],uVar47);
  uVar48 = pavgb(auVar41[3],uVar48);
  uVar36 = CONCAT13(uVar48,CONCAT12(uVar47,CONCAT11(uVar46,uVar45)));
  uVar45 = pavgb(auVar41[4],uVar52);
  uVar37 = CONCAT14(uVar45,uVar36);
  uVar45 = pavgb(auVar41[5],uVar34);
  uVar38 = CONCAT15(uVar45,uVar37);
  uVar45 = pavgb(auVar41[6],uVar35);
  pavgb(auVar41[7],uVar24);
  pavgb(auVar41[8],0);
  pavgb(auVar41[9],0);
  pavgb(auVar41[10],0);
  pavgb(auVar41[0xb],0);
  pavgb(auVar41[0xc],0);
  pavgb(auVar41[0xd],0);
  pavgb(auVar41[0xe],0);
  pavgb(auVar41[0xf],0);
  *(undefined4 *)(dst + 0x670) = uVar36;
  *(int *)(dst + 0x650) = (int)((uint5)uVar37 >> 8);
  *(int *)(dst + 0x630) = (int)((uint6)uVar38 >> 0x10);
  *(int *)(dst + 0x610) = (int)(CONCAT16(uVar45,uVar38) >> 0x18);
  bVar3 = (byte)*(ushort *)(top + -2);
  bVar4 = top[-3];
  bVar5 = top[-4];
  bVar6 = top[-1];
  uVar12 = *(ushort *)(top + -2);
  uVar1 = *(ulong *)(top + -1);
  auVar42._0_8_ = uVar1 >> 8;
  auVar42._8_8_ = 0;
  uVar11 = uVar1 & 0xffffffffffff00;
  auVar49._8_8_ = uVar1 >> 0x38;
  auVar49._0_8_ = uVar11 << 8 | (ulong)uVar12;
  uVar46 = (undefined1)(uVar1 >> 8);
  auVar55[0] = pavgb((char)uVar12,uVar46);
  uVar47 = (undefined1)(uVar1 >> 0x10);
  auVar55[1] = pavgb((char)(uVar12 >> 8),uVar47);
  uVar48 = (undefined1)(uVar1 >> 0x18);
  auVar55[2] = pavgb((char)(uVar11 >> 8),uVar48);
  uVar52 = (undefined1)(uVar1 >> 0x20);
  auVar55[3] = pavgb((char)(uVar11 >> 0x10),uVar52);
  uVar34 = (undefined1)(uVar1 >> 0x28);
  auVar55[4] = pavgb((char)(uVar11 >> 0x18),uVar34);
  uVar35 = (undefined1)(uVar1 >> 0x30);
  auVar55[5] = pavgb((char)(uVar11 >> 0x20),uVar35);
  uVar53 = (undefined1)(uVar1 >> 0x38);
  auVar55[6] = pavgb((char)(uVar11 >> 0x28),uVar53);
  auVar55[7] = pavgb((char)(uVar11 >> 0x30),0);
  auVar55[8] = pavgb(uVar53,0);
  auVar55[9] = pavgb(0,0);
  auVar55[10] = pavgb(0,0);
  auVar55[0xb] = pavgb(0,0);
  auVar55[0xc] = pavgb(0,0);
  auVar55[0xd] = pavgb(0,0);
  auVar55[0xe] = pavgb(0,0);
  auVar55[0xf] = pavgb(0,0);
  auVar41 = psubusb(auVar55,(auVar49 ^ auVar42) & auVar27);
  uVar45 = pavgb(auVar41[0],(char)uVar1);
  uVar57 = pavgb(auVar41[1],uVar46);
  uVar58 = pavgb(auVar41[2],uVar47);
  uVar59 = pavgb(auVar41[3],uVar48);
  iVar54 = CONCAT13(uVar59,CONCAT12(uVar58,CONCAT11(uVar57,uVar45)));
  pavgb(auVar41[4],uVar52);
  pavgb(auVar41[5],uVar34);
  pavgb(auVar41[6],uVar35);
  pavgb(auVar41[7],uVar53);
  pavgb(auVar41[8],0);
  pavgb(auVar41[9],0);
  pavgb(auVar41[10],0);
  pavgb(auVar41[0xb],0);
  pavgb(auVar41[0xc],0);
  pavgb(auVar41[0xd],0);
  pavgb(auVar41[0xe],0);
  pavgb(auVar41[0xf],0);
  uVar45 = pavgb((char)uVar1,uVar46);
  uVar46 = pavgb(uVar46,uVar47);
  uVar47 = pavgb(uVar47,uVar48);
  uVar48 = pavgb(uVar48,uVar52);
  iVar22 = CONCAT13(uVar48,CONCAT12(uVar47,CONCAT11(uVar46,uVar45)));
  pavgb(uVar52,uVar34);
  pavgb(uVar34,uVar35);
  pavgb(uVar35,uVar53);
  pavgb(uVar53,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  *(int *)(dst + 0x614) = iVar22;
  *(int *)(dst + 0x634) = iVar54;
  *(int *)(dst + 0x654) = iVar22 << 8;
  *(int *)(dst + 0x674) = iVar54 << 8;
  dst[0x654] = (uint8_t)((uint)bVar4 + (uint)bVar3 * 2 + (uint)bVar6 + 2 >> 2);
  dst[0x674] = (uint8_t)((uint)bVar5 + (uint)bVar3 + (uint)bVar4 * 2 + 2 >> 2);
  uVar11 = *(ulong *)top;
  uVar1 = *(ulong *)top;
  auVar32._8_4_ = (int)uVar11;
  auVar32._0_8_ = uVar11;
  auVar32._12_4_ = (int)(uVar11 >> 0x20);
  auVar50[0] = pavgb((char)uVar1,(char)(uVar11 >> 0x10));
  uVar47 = (undefined1)(uVar1 >> 8);
  auVar50[1] = pavgb(uVar47,(char)(uVar11 >> 0x18));
  uVar48 = (undefined1)(uVar1 >> 0x10);
  auVar50[2] = pavgb(uVar48,(char)(uVar11 >> 0x20));
  uVar52 = (undefined1)(uVar1 >> 0x18);
  auVar50[3] = pavgb(uVar52,(char)(uVar11 >> 0x28));
  uVar34 = (undefined1)(uVar1 >> 0x20);
  auVar50[4] = pavgb(uVar34,(char)(uVar11 >> 0x30));
  uVar46 = (undefined1)(uVar11 >> 0x38);
  uVar35 = (undefined1)(uVar1 >> 0x28);
  auVar50[5] = pavgb(uVar35,uVar46);
  uVar53 = (undefined1)(uVar1 >> 0x30);
  uVar45 = (undefined1)(uVar1 >> 0x38);
  auVar50[6] = pavgb(uVar53,uVar46);
  auVar50[7] = pavgb(uVar45,0);
  auVar50[8] = pavgb(0,0);
  auVar50[9] = pavgb(0,0);
  auVar50[10] = pavgb(0,0);
  auVar50[0xb] = pavgb(0,0);
  auVar50[0xc] = pavgb(0,0);
  auVar50[0xd] = pavgb(0,0);
  auVar50[0xe] = pavgb(0,0);
  auVar50[0xf] = pavgb(0,0);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (auVar32._8_8_ >> 0x10 | (uVar11 >> 0x38) << 0x30) ^ uVar1;
  auVar41 = psubusb(auVar50,auVar33 & auVar27);
  uVar46 = pavgb(auVar41[0],uVar47);
  uVar47 = pavgb(auVar41[1],uVar48);
  uVar48 = pavgb(auVar41[2],uVar52);
  uVar52 = pavgb(auVar41[3],uVar34);
  uVar36 = CONCAT13(uVar52,CONCAT12(uVar48,CONCAT11(uVar47,uVar46)));
  uVar46 = pavgb(auVar41[4],uVar35);
  uVar37 = CONCAT14(uVar46,uVar36);
  uVar46 = pavgb(auVar41[5],uVar53);
  uVar38 = CONCAT15(uVar46,uVar37);
  uVar45 = pavgb(auVar41[6],uVar45);
  pavgb(auVar41[7],0);
  pavgb(auVar41[8],0);
  pavgb(auVar41[9],0);
  pavgb(auVar41[10],0);
  pavgb(auVar41[0xb],0);
  pavgb(auVar41[0xc],0);
  pavgb(auVar41[0xd],0);
  pavgb(auVar41[0xe],0);
  pavgb(auVar41[0xf],0);
  *(undefined4 *)(dst + 0x618) = uVar36;
  *(int *)(dst + 0x638) = (int)((uint5)uVar37 >> 8);
  *(int *)(dst + 0x658) = (int)((uint6)uVar38 >> 0x10);
  *(int *)(dst + 0x678) = (int)(CONCAT16(uVar45,uVar38) >> 0x18);
  uVar1 = *(ulong *)top;
  auVar43._0_8_ = uVar1 >> 8;
  auVar43._8_8_ = 0;
  auVar51._8_4_ = (int)uVar1;
  auVar51._0_8_ = uVar1;
  auVar51._12_4_ = (int)(uVar1 >> 0x20);
  uVar45 = (undefined1)(uVar1 >> 8);
  uVar53 = pavgb((char)uVar1,uVar45);
  uVar46 = (undefined1)(uVar1 >> 0x10);
  uVar57 = pavgb(uVar45,uVar46);
  uVar47 = (undefined1)(uVar1 >> 0x18);
  uVar58 = pavgb(uVar46,uVar47);
  uVar48 = (undefined1)(uVar1 >> 0x20);
  uVar59 = pavgb(uVar47,uVar48);
  uVar36 = CONCAT13(uVar59,CONCAT12(uVar58,CONCAT11(uVar57,uVar53)));
  uVar52 = (undefined1)(uVar1 >> 0x28);
  uVar60 = pavgb(uVar48,uVar52);
  auVar56._0_5_ = CONCAT14(uVar60,uVar36);
  uVar34 = (undefined1)(uVar1 >> 0x30);
  auVar56[5] = pavgb(uVar52,uVar34);
  uVar35 = (undefined1)(uVar1 >> 0x38);
  auVar56[6] = pavgb(uVar34,uVar35);
  auVar56[7] = pavgb(uVar35,0);
  auVar56[8] = pavgb(0,0);
  auVar56[9] = pavgb(0,0);
  auVar56[10] = pavgb(0,0);
  auVar56[0xb] = pavgb(0,0);
  auVar56[0xc] = pavgb(0,0);
  auVar56[0xd] = pavgb(0,0);
  auVar56[0xe] = pavgb(0,0);
  auVar56[0xf] = pavgb(0,0);
  auVar61[0] = pavgb(uVar46,uVar45);
  auVar61[1] = pavgb(uVar47,uVar46);
  auVar61[2] = pavgb(uVar48,uVar47);
  auVar61[3] = pavgb(uVar52,uVar48);
  auVar61[4] = pavgb(uVar34,uVar52);
  auVar61[5] = pavgb(uVar35,uVar34);
  auVar61[6] = pavgb(0,uVar35);
  auVar61[7] = pavgb(0,0);
  auVar61[8] = pavgb(0,0);
  auVar61[9] = pavgb(0,0);
  auVar61[10] = pavgb(0,0);
  auVar61[0xb] = pavgb(0,0);
  auVar61[0xc] = pavgb(0,0);
  auVar61[0xd] = pavgb(0,0);
  auVar61[0xe] = pavgb(0,0);
  auVar61[0xf] = pavgb(0,0);
  auVar62[0] = pavgb(uVar53,auVar61[0]);
  auVar62[1] = pavgb(uVar57,auVar61[1]);
  auVar62[2] = pavgb(uVar58,auVar61[2]);
  auVar62[3] = pavgb(uVar59,auVar61[3]);
  auVar62[4] = pavgb(uVar60,auVar61[4]);
  auVar62[5] = pavgb(auVar56[5],auVar61[5]);
  auVar62[6] = pavgb(auVar56[6],auVar61[6]);
  auVar62[7] = pavgb(auVar56[7],auVar61[7]);
  auVar62[8] = pavgb(auVar56[8],auVar61[8]);
  auVar62[9] = pavgb(auVar56[9],auVar61[9]);
  auVar62[10] = pavgb(auVar56[10],auVar61[10]);
  auVar62[0xb] = pavgb(auVar56[0xb],auVar61[0xb]);
  auVar62[0xc] = pavgb(auVar56[0xc],auVar61[0xc]);
  auVar62[0xd] = pavgb(auVar56[0xd],auVar61[0xd]);
  auVar62[0xe] = pavgb(auVar56[0xe],auVar61[0xe]);
  auVar62[0xf] = pavgb(auVar56[0xf],auVar61[0xf]);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar43._0_8_ ^ uVar1;
  auVar27 = psubusb(auVar62,(auVar44 | auVar51 >> 0x50 ^ auVar43) & (auVar61 ^ auVar56) & auVar27);
  *(undefined4 *)(dst + 0x61c) = uVar36;
  *(int *)(dst + 0x63c) = auVar27._0_4_;
  *(int *)(dst + 0x65c) = (int)((uint5)auVar56._0_5_ >> 8);
  *(int *)(dst + 0x67c) = auVar27._1_4_;
  dst[0x65f] = auVar27[4];
  dst[0x67f] = auVar27[5];
  bVar3 = top[-1];
  bVar4 = top[-2];
  bVar5 = top[-3];
  bVar6 = top[-4];
  bVar7 = top[-5];
  bVar8 = *top;
  bVar9 = top[1];
  bVar10 = top[2];
  uVar24 = (uint8_t)((uint)bVar4 + (uint)bVar3 + 1 >> 1);
  dst[0x6a2] = uVar24;
  dst[0x680] = uVar24;
  uVar24 = (uint8_t)((uint)bVar4 + (uint)bVar5 + 1 >> 1);
  dst[0x6c2] = uVar24;
  dst[0x6a0] = uVar24;
  uVar24 = (uint8_t)((uint)bVar6 + (uint)bVar5 + 1 >> 1);
  dst[0x6e2] = uVar24;
  dst[0x6c0] = uVar24;
  dst[0x6e0] = (uint8_t)((uint)bVar6 + (uint)bVar7 + 1 >> 1);
  dst[0x683] = (uint8_t)((uint)bVar10 + (uint)bVar8 + (uint)bVar9 * 2 + 2 >> 2);
  dst[0x682] = (uint8_t)((uint)bVar3 + (uint)bVar8 * 2 + 2 + (uint)bVar9 >> 2);
  uVar24 = (uint8_t)((uint)bVar4 + (uint)bVar3 * 2 + 2 + (uint)bVar8 >> 2);
  dst[0x6a3] = uVar24;
  dst[0x681] = uVar24;
  uVar24 = (uint8_t)((uint)bVar3 + (uint)bVar5 + 2 + (uint)bVar4 * 2 >> 2);
  dst[0x6c3] = uVar24;
  dst[0x6a1] = uVar24;
  uVar24 = (uint8_t)((uint)bVar4 + (uint)bVar6 + 2 + (uint)bVar5 * 2 >> 2);
  dst[0x6e3] = uVar24;
  dst[0x6c1] = uVar24;
  dst[0x6e1] = (uint8_t)((uint)bVar5 + (uint)bVar7 + (uint)bVar6 * 2 + 2 >> 2);
  bVar3 = top[-2];
  bVar4 = top[-3];
  bVar5 = top[-4];
  bVar6 = top[-5];
  dst[0x684] = (uint8_t)((uint)bVar4 + (uint)bVar3 + 1 >> 1);
  uVar24 = (uint8_t)((uint)bVar4 + (uint)bVar5 + 1 >> 1);
  dst[0x6a4] = uVar24;
  dst[0x686] = uVar24;
  uVar24 = (uint8_t)((uint)bVar5 + (uint)bVar6 + 1 >> 1);
  dst[0x6c4] = uVar24;
  dst[0x6a6] = uVar24;
  dst[0x685] = (uint8_t)((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2);
  uVar24 = (uint8_t)((uint)bVar4 + (uint)bVar6 + (uint)bVar5 * 2 + 2 >> 2);
  dst[0x6a5] = uVar24;
  dst[0x687] = uVar24;
  uVar24 = (uint8_t)((uint)bVar5 + (uint)bVar6 + 2 + (uint)bVar6 * 2 >> 2);
  dst[0x6c5] = uVar24;
  dst[0x6a7] = uVar24;
  auVar27 = pshuflw(ZEXT216(CONCAT11(bVar6,bVar6)),ZEXT216(CONCAT11(bVar6,bVar6)),0);
  *(int *)(dst + 0x6e4) = auVar27._0_4_;
  dst[0x6c6] = bVar6;
  dst[0x6c7] = bVar6;
  return;
}

Assistant:

static WEBP_INLINE void DC4_SSE2(uint8_t* dst, const uint8_t* top) {
  uint32_t dc = 4;
  int i;
  for (i = 0; i < 4; ++i) dc += top[i] + top[-5 + i];
  Fill_SSE2(dst, dc >> 3, 4);
}